

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O3

Command * __thiscall
anon_unknown.dwarf_441605::OwnershipAnalysis::includedOwnerOf
          (OwnershipAnalysis *this,StringRef inputPath)

{
  long *plVar1;
  void *__s2;
  size_t __n;
  int iVar2;
  long *plVar3;
  _Base_ptr p_Var4;
  Command *pCVar5;
  _Rb_tree_header *p_Var6;
  long *__s2_00;
  bool bVar7;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50;
  ulong local_48;
  long local_40;
  long lStack_38;
  
  p_Var4 = (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->includedPaths)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      __s2 = *(void **)(*(long *)(p_Var4 + 1) + 8);
      __n = *(size_t *)(*(long *)(p_Var4 + 1) + 0x10);
      if (__n == 0) {
        if (__s2 != (void *)0x0) goto LAB_001b0226;
        local_68 = 0;
        local_60 = 0;
        local_70 = &local_60;
LAB_001b024b:
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        plVar1 = plVar3 + 2;
        if ((long *)*plVar3 == plVar1) {
          local_40 = *plVar1;
          lStack_38 = plVar3[3];
          __s2_00 = &local_40;
        }
        else {
          local_40 = *plVar1;
          __s2_00 = (long *)*plVar3;
        }
        local_48 = plVar3[1];
        *plVar3 = (long)plVar1;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        local_50 = __s2_00;
        if (inputPath.Length < local_48) {
          bVar7 = false;
        }
        else if (local_48 == 0) {
          bVar7 = true;
        }
        else {
          iVar2 = bcmp(inputPath.Data,__s2_00,local_48);
          bVar7 = iVar2 == 0;
        }
        if (__s2_00 != &local_40) {
          operator_delete(__s2_00,local_40 + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
        }
        if (bVar7) break;
      }
      else {
        if (*(char *)((long)__s2 + (__n - 1)) != '/') {
LAB_001b0226:
          local_70 = &local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s2,__n + (long)__s2)
          ;
          goto LAB_001b024b;
        }
        if ((__n <= inputPath.Length) && (iVar2 = bcmp(inputPath.Data,__s2,__n), iVar2 == 0)) break;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var6) {
    pCVar5 = (Command *)0x0;
  }
  else {
    pCVar5 = (Command *)p_Var4[1]._M_parent;
  }
  return pCVar5;
}

Assistant:

Command* includedOwnerOf(StringRef inputPath) {
    auto it = std::find_if(includedPaths.begin(), includedPaths.end(), [inputPath](const std::pair<BuildNode*, Command*>& buildNodeAndCommand) -> bool {
      if (buildNodeAndCommand.first->getName().endswith("/")) {
        return inputPath.startswith(buildNodeAndCommand.first->getName());
      } else {
        return inputPath.startswith(buildNodeAndCommand.first->getName().str() + "/");
      }
    });

    if (it != includedPaths.end()) {
      return (*it).second;
    } else {
      return nullptr;
    }
  }